

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O1

void duckdb::Storage::VerifyBlockAllocSize(idx_t block_alloc_size)

{
  InvalidInputException *pIVar1;
  bool bVar2;
  string local_40;
  
  bVar2 = IsPowerOfTwo(block_alloc_size);
  if (!bVar2) {
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"the block size must be a power of two, got %llu","");
    InvalidInputException::InvalidInputException<unsigned_long>(pIVar1,&local_40,block_alloc_size);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (0x3fff < block_alloc_size) {
    if (block_alloc_size < 0x40001) {
      return;
    }
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "the block size must be lesser or equal than the maximum block size of %llu, got %llu"
               ,"");
    InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
              (pIVar1,&local_40,0x40000,block_alloc_size);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "the block size must be greater or equal than the minimum block size of %llu, got %llu"
             ,"");
  InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
            (pIVar1,&local_40,0x4000,block_alloc_size);
  __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Storage::VerifyBlockAllocSize(const idx_t block_alloc_size) {
	if (!IsPowerOfTwo(block_alloc_size)) {
		throw InvalidInputException("the block size must be a power of two, got %llu", block_alloc_size);
	}
	if (block_alloc_size < MIN_BLOCK_ALLOC_SIZE) {
		throw InvalidInputException(
		    "the block size must be greater or equal than the minimum block size of %llu, got %llu",
		    MIN_BLOCK_ALLOC_SIZE, block_alloc_size);
	}
	if (block_alloc_size > MAX_BLOCK_ALLOC_SIZE) {
		throw InvalidInputException(
		    "the block size must be lesser or equal than the maximum block size of %llu, got %llu",
		    MAX_BLOCK_ALLOC_SIZE, block_alloc_size);
	}
	auto max_value = NumericCast<idx_t>(NumericLimits<int32_t>().Maximum());
	if (block_alloc_size > max_value) {
		throw InvalidInputException(
		    "the block size must not be greater than the maximum 32-bit signed integer value of %llu, got %llu",
		    max_value, block_alloc_size);
	}
}